

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O0

FT_Error FT_Gzip_Uncompress(FT_Memory memory,FT_Byte *output,FT_ULong *output_len,FT_Byte *input,
                           FT_ULong input_len)

{
  int iVar1;
  int local_ac;
  undefined1 auStack_a8 [4];
  int err;
  z_stream stream;
  FT_ULong input_len_local;
  FT_Byte *input_local;
  FT_ULong *output_len_local;
  FT_Byte *output_local;
  FT_Memory memory_local;
  
  if (((memory == (FT_Memory)0x0) || (output_len == (FT_ULong *)0x0)) || (output == (FT_Byte *)0x0))
  {
    memory_local._4_4_ = 6;
  }
  else {
    stream.next_in._0_4_ = (undefined4)input_len;
    stream.next_out._0_4_ = (undefined4)*output_len;
    stream.state = (internal_state *)ft_gzip_alloc;
    stream.zalloc = ft_gzip_free;
    _auStack_a8 = input;
    stream.total_in = (uLong)output;
    stream.zfree = (free_func)memory;
    stream.reserved = input_len;
    iVar1 = inflateInit2_((z_streamp)auStack_a8,0x2f,"1.2.11",0x70);
    if (iVar1 == 0) {
      local_ac = inflate((z_streamp)auStack_a8,4);
      if (local_ac == 1) {
        *output_len = stream._32_8_;
        local_ac = inflateEnd((z_streamp)auStack_a8);
      }
      else {
        inflateEnd((z_streamp)auStack_a8);
        if (local_ac == 0) {
          local_ac = -5;
        }
      }
      if (local_ac == -4) {
        memory_local._4_4_ = 0x40;
      }
      else if (local_ac == -5) {
        memory_local._4_4_ = 10;
      }
      else if (local_ac == -3) {
        memory_local._4_4_ = 8;
      }
      else if (local_ac == 2) {
        memory_local._4_4_ = 8;
      }
      else {
        memory_local._4_4_ = 0;
      }
    }
    else {
      memory_local._4_4_ = 6;
    }
  }
  return memory_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Gzip_Uncompress( FT_Memory       memory,
                      FT_Byte*        output,
                      FT_ULong*       output_len,
                      const FT_Byte*  input,
                      FT_ULong        input_len )
  {
    z_stream  stream;
    int       err;


    /* check for `input' delayed to `inflate' */

    if ( !memory || !output_len || !output )
      return FT_THROW( Invalid_Argument );

    /* this function is modeled after zlib's `uncompress' function */

    stream.next_in  = (Bytef*)input;
    stream.avail_in = (uInt)input_len;

    stream.next_out  = output;
    stream.avail_out = (uInt)*output_len;

    stream.zalloc = ft_gzip_alloc;
    stream.zfree  = ft_gzip_free;
    stream.opaque = memory;

    err = inflateInit2( &stream, MAX_WBITS|32 );

    if ( err != Z_OK )
      return FT_THROW( Invalid_Argument );

    err = inflate( &stream, Z_FINISH );
    if ( err != Z_STREAM_END )
    {
      inflateEnd( &stream );
      if ( err == Z_OK )
        err = Z_BUF_ERROR;
    }
    else
    {
      *output_len = stream.total_out;

      err = inflateEnd( &stream );
    }

    if ( err == Z_MEM_ERROR )
      return FT_THROW( Out_Of_Memory );

    if ( err == Z_BUF_ERROR )
      return FT_THROW( Array_Too_Large );

    if ( err == Z_DATA_ERROR )
      return FT_THROW( Invalid_Table );

    if ( err == Z_NEED_DICT )
      return FT_THROW( Invalid_Table );

    return FT_Err_Ok;
  }